

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O0

void CMCondition_trigger(CManager cm,CMCondition cond,CMControlList cl)

{
  long in_RSI;
  long in_RDI;
  
  if (cm_control_debug_flag != 0) {
    fprintf(*(FILE **)(in_RDI + 0x120),"CMLowLevel Triggering CMcondition %d\n",
            (ulong)*(uint *)(in_RSI + 8));
  }
  if (*(int *)(in_RSI + 0xc) != 0) {
    if (cm_control_debug_flag != 0) {
      fprintf(*(FILE **)(in_RDI + 0x120),"CMLowLevel Triggering CMcondition %d\n",
              (ulong)*(uint *)(in_RSI + 8));
    }
    pthread_cond_signal((pthread_cond_t *)(in_RSI + 0x18));
  }
  if (cm_control_debug_flag != 0) {
    fprintf(*(FILE **)(in_RDI + 0x120),"CMLowLevel After trigger for CMcondition %d\n",
            (ulong)*(uint *)(in_RSI + 8));
  }
  return;
}

Assistant:

static void
CMCondition_trigger(CManager cm, CMCondition cond, CMControlList cl)
{
    (void)cl;
    if (cm_control_debug_flag) {
	fprintf(cm->CMTrace_file, "CMLowLevel Triggering CMcondition %d\n", cond->condition_num);
    }
    if (cond->waiting) {
	if (cm_control_debug_flag) {
	    fprintf(cm->CMTrace_file, "CMLowLevel Triggering CMcondition %d\n", 
		   cond->condition_num);
	}
	thr_condition_signal(cond->cond_condition);
    }
    if (cm_control_debug_flag) {
	fprintf(cm->CMTrace_file, "CMLowLevel After trigger for CMcondition %d\n", 
	       cond->condition_num);
    }
}